

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::message::~message(message *this)

{
  message *this_local;
  
  ~message(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

~message() throw() {}